

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  pointer *__ptr;
  undefined1 local_4e8 [8];
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  tokens;
  allocator local_4c8 [32];
  DefaultEvaluator eval;
  string local_498;
  Lexer lexer;
  Parser parser;
  stringstream output;
  ostream local_388 [376];
  ifstream source;
  
  std::ifstream::ifstream
            (&source,"C:\\Users\\Freddy\\Documents\\GitHub\\ninx\\examples\\example12.txt",_S_bin);
  std::__cxx11::string::string((string *)&local_498,"tests",(allocator *)&output);
  ninx::lexer::Lexer::Lexer(&lexer,(istream *)&source,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  ninx::lexer::Lexer::set_verbose(&lexer,true);
  ninx::lexer::Lexer::generate(&tokens,&lexer);
  std::__cxx11::string::string((string *)&output,"tests",local_4c8);
  ninx::parser::Parser::Parser(&parser,&tokens,(string *)&output);
  std::__cxx11::string::~string((string *)&output);
  ninx::parser::Parser::parse((Parser *)local_4e8);
  poVar1 = ninx::parser::element::operator<<((ostream *)&std::cout,(ASTElement *)local_4e8);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"############ OUTPUT #############");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringstream::stringstream((stringstream *)&output);
  ninx::evaluator::DefaultEvaluator::DefaultEvaluator(&eval,local_388);
  ninx::evaluator::DefaultEvaluator::evaluate(&eval,(Block *)local_4e8);
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_4c8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_4c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&output);
  if (local_4e8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_4e8 + 8))();
  }
  ninx::parser::Parser::~Parser(&parser);
  std::
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  ::~vector(&tokens);
  ninx::lexer::Lexer::~Lexer(&lexer);
  std::ifstream::~ifstream(&source);
  return 0;
}

Assistant:

int main() {
    //std::ifstream source{R"(/Users/freddy/Documents/GitHub/ninx/examples/example11.txt)", std::ios_base::binary};
    std::ifstream source{R"(C:\Users\Freddy\Documents\GitHub\ninx\examples\example12.txt)", std::ios_base::binary};

    Lexer lexer {source, "tests"};
    lexer.set_verbose(true);

    auto tokens = lexer.generate();

    Parser parser{tokens, "tests"};

    auto ast = parser.parse();

    std::cout << *ast << std::endl;

    std::cout << "############ OUTPUT #############" << std::endl;

    std::stringstream output;
    DefaultEvaluator eval {output};
    eval.evaluate(ast.get());

    std::cout << output.str() << std::endl;

    return 0;
}